

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O2

HighsStatus __thiscall
Highs::getDualUnboundednessDirection
          (Highs *this,bool *has_dual_unboundedness_direction,
          double *dual_unboundedness_direction_value)

{
  uint uVar1;
  HighsStatus HVar2;
  HighsStatus HVar3;
  ulong uVar4;
  ulong uVar5;
  vector<double,_std::allocator<double>_> dual_unboundedness_direction;
  vector<double,_std::allocator<double>_> dual_ray_value;
  
  if (dual_unboundedness_direction_value != (double *)0x0) {
    std::vector<double,_std::allocator<double>_>::vector
              (&dual_ray_value,(long)(this->model_).lp_.num_row_,
               (allocator_type *)&dual_unboundedness_direction);
    HVar2 = getDualRay(this,has_dual_unboundedness_direction,
                       dual_ray_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start);
    HVar3 = kError;
    if ((HVar2 == kOk) && (*has_dual_unboundedness_direction != false)) {
      dual_unboundedness_direction.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      dual_unboundedness_direction.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      dual_unboundedness_direction.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      HighsSparseMatrix::productTransposeQuad
                (&(this->model_).lp_.a_matrix_,&dual_unboundedness_direction,&dual_ray_value,-2);
      uVar1 = (this->model_).lp_.num_col_;
      uVar5 = 0;
      uVar4 = (ulong)uVar1;
      if ((int)uVar1 < 1) {
        uVar4 = uVar5;
      }
      for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
        dual_unboundedness_direction_value[uVar5] =
             dual_unboundedness_direction.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start[uVar5];
      }
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&dual_unboundedness_direction.super__Vector_base<double,_std::allocator<double>_>);
      HVar3 = kOk;
    }
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&dual_ray_value.super__Vector_base<double,_std::allocator<double>_>);
    return HVar3;
  }
  HVar3 = getDualRay(this,has_dual_unboundedness_direction,(double *)0x0);
  return HVar3;
}

Assistant:

HighsStatus Highs::getDualUnboundednessDirection(
    bool& has_dual_unboundedness_direction,
    double* dual_unboundedness_direction_value) {
  if (dual_unboundedness_direction_value) {
    std::vector<double> dual_ray_value(this->model_.lp_.num_row_);
    HighsStatus status =
        getDualRay(has_dual_unboundedness_direction, dual_ray_value.data());
    if (status != HighsStatus::kOk || !has_dual_unboundedness_direction)
      return HighsStatus::kError;
    std::vector<double> dual_unboundedness_direction;
    this->model_.lp_.a_matrix_.productTransposeQuad(
        dual_unboundedness_direction, dual_ray_value);
    for (HighsInt iCol = 0; iCol < this->model_.lp_.num_col_; iCol++)
      dual_unboundedness_direction_value[iCol] =
          dual_unboundedness_direction[iCol];
  } else {
    return getDualRay(has_dual_unboundedness_direction, nullptr);
  }
  return HighsStatus::kOk;
}